

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_0000008c;
  longlong lVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  undefined1 in_XMM0 [16];
  undefined1 auVar8 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  __m128i alVar10;
  __m128i alVar11;
  
  lVar3 = CONCAT44(in_register_0000008c,src1_stride);
  lVar1 = (ulong)src0_stride * 2;
  puVar4 = src0;
  puVar6 = src1;
  do {
    puVar5 = puVar4;
    puVar7 = puVar6;
    for (lVar2 = 0; lVar2 < w; lVar2 = lVar2 + 8) {
      auVar8 = pmovzxbw(in_XMM0,*(undefined8 *)(mask + lVar2));
      auVar9 = pmovsxbw(in_XMM1,0x4040404040404040);
      in_XMM1._0_2_ = auVar9._0_2_ - auVar8._0_2_;
      in_XMM1._2_2_ = auVar9._2_2_ - auVar8._2_2_;
      in_XMM1._4_2_ = auVar9._4_2_ - auVar8._4_2_;
      in_XMM1._6_2_ = auVar9._6_2_ - auVar8._6_2_;
      in_XMM1._8_2_ = auVar9._8_2_ - auVar8._8_2_;
      in_XMM1._10_2_ = auVar9._10_2_ - auVar8._10_2_;
      in_XMM1._12_2_ = auVar9._12_2_ - auVar8._12_2_;
      in_XMM1._14_2_ = auVar9._14_2_ - auVar8._14_2_;
      alVar10[1] = lVar1;
      alVar10[0] = (longlong)src0;
      alVar11[1] = lVar3;
      alVar11[0] = (longlong)src1;
      alVar10 = (*blend)(puVar5,puVar7,alVar10,alVar11);
      src0 = alVar10[1];
      *(undefined1 (*) [16])(dst + lVar2) = extraout_XMM0;
      puVar7 = puVar7 + 8;
      puVar5 = puVar5 + 8;
      in_XMM0 = extraout_XMM0;
    }
    mask = mask + mask_stride;
    dst = dst + dst_stride;
    puVar6 = puVar6 + src1_stride;
    puVar4 = puVar4 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_m0_b = xx_loadl_64(mask + c);
      const __m128i v_m0_w = _mm_cvtepu8_epi16(v_m0_b);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}